

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

void __thiscall Character::DropAll(Character *this,Character *killer)

{
  size_t *psVar1;
  uint id;
  _List_node_base *p_Var2;
  World *pWVar3;
  bool bVar4;
  EIF_Data *pEVar5;
  mapped_type *pmVar6;
  long lVar7;
  uint uVar8;
  _List_node_base *p_Var9;
  short item;
  int num;
  double dVar10;
  shared_ptr<Map_Item> map_item;
  PacketBuilder builder;
  double local_88;
  undefined1 local_80 [16];
  _List_node_base **local_70 [2];
  _List_node_base *local_60 [4];
  pointer local_40;
  Character *local_38;
  
  if ((this->nointeract & 2) == 0) {
    p_Var9 = (this->inventory).super__List_base<Character_Item,_std::allocator<Character_Item>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    local_38 = killer;
    if (p_Var9 != (_List_node_base *)&this->inventory) {
      do {
        pEVar5 = EIF::Get(this->world->eif,(int)*(short *)&p_Var9[1]._M_next);
        if (pEVar5->special == Lore) {
          p_Var9 = p_Var9->_M_next;
        }
        else {
          Map::AddItem((Map *)local_80,(short)this->player->character->map,
                       (int)*(short *)&p_Var9[1]._M_next,
                       (uchar)*(undefined4 *)((long)&p_Var9[1]._M_next + 4),this->x,
                       (Character *)(ulong)this->y);
          if ((World *)local_80._0_8_ != (World *)0x0) {
            if (local_38 == (Character *)0x0) {
              *(uint *)((long)&(((Timer *)(local_80._0_8_ + 8))->impl)._M_t.
                               super___uniq_ptr_impl<Timer::impl_t,_std::default_delete<Timer::impl_t>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Timer::impl_t_*,_std::default_delete<Timer::impl_t>_>
                               .super__Head_base<0UL,_Timer::impl_t_*,_false> + 4) =
                   this->player->id;
              local_88 = Timer::GetTime();
              pWVar3 = this->world;
              local_70[0] = local_60;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_70,"ProtectDeathDrop","");
              pmVar6 = std::__detail::
                       _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&pWVar3->config,(key_type *)local_70);
              dVar10 = util::variant::GetFloat(pmVar6);
            }
            else {
              *(uint *)((long)&(((Timer *)(local_80._0_8_ + 8))->impl)._M_t.
                               super___uniq_ptr_impl<Timer::impl_t,_std::default_delete<Timer::impl_t>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Timer::impl_t_*,_std::default_delete<Timer::impl_t>_>
                               .super__Head_base<0UL,_Timer::impl_t_*,_false> + 4) =
                   local_38->player->id;
              local_88 = Timer::GetTime();
              pWVar3 = this->world;
              local_70[0] = local_60;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"ProtectPKDrop","")
              ;
              pmVar6 = std::__detail::
                       _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&pWVar3->config,(key_type *)local_70);
              dVar10 = util::variant::GetFloat(pmVar6);
            }
            *(double *)&(((Timer *)(local_80._0_8_ + 8))->timers)._M_t._M_impl = local_88 + dVar10;
            if (local_70[0] != local_60) {
              operator_delete(local_70[0],(ulong)((long)&local_60[0]->_M_next + 1));
            }
            PacketBuilder::PacketBuilder((PacketBuilder *)local_70,PACKET_ITEM,PACKET_DROP,0xf);
            PacketBuilder::AddShort((PacketBuilder *)local_70,(int)*(short *)&p_Var9[1]._M_next);
            PacketBuilder::AddThree
                      ((PacketBuilder *)local_70,*(int *)((long)&p_Var9[1]._M_next + 4));
            PacketBuilder::AddInt((PacketBuilder *)local_70,0);
            PacketBuilder::AddShort((PacketBuilder *)local_70,(int)(short)*(int *)local_80._0_8_);
            PacketBuilder::AddChar((PacketBuilder *)local_70,(uint)this->x);
            PacketBuilder::AddChar((PacketBuilder *)local_70,(uint)this->y);
            PacketBuilder::AddChar((PacketBuilder *)local_70,this->weight);
            PacketBuilder::AddChar((PacketBuilder *)local_70,this->maxweight);
            Player::Send(this->player,(PacketBuilder *)local_70);
            PacketBuilder::~PacketBuilder((PacketBuilder *)local_70);
          }
          p_Var2 = p_Var9->_M_next;
          psVar1 = &(this->inventory).
                    super__List_base<Character_Item,_std::allocator<Character_Item>_>._M_impl.
                    _M_node._M_size;
          *psVar1 = *psVar1 - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var9,0x18);
          p_Var9 = p_Var2;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
          }
        }
      } while (p_Var9 != (_List_node_base *)&this->inventory);
    }
    CalculateStats(this,true);
    lVar7 = 0x2e8;
    uVar8 = 0xfffffff6;
    do {
      id = *(uint *)((long)&(this->super_Command_Source)._vptr_Command_Source + lVar7);
      if (id != 0) {
        pEVar5 = EIF::Get(this->world->eif,id);
        if (pEVar5->special != Lore) {
          pEVar5 = EIF::Get(this->world->eif,id);
          if (pEVar5->special != Cursed) {
            item = (short)id;
            Map::AddItem((Map *)local_80,(short)this->player->character->map,(int)item,'\x01',
                         this->x,(Character *)(ulong)this->y);
            if ((World *)local_80._0_8_ != (World *)0x0) {
              if (local_38 == (Character *)0x0) {
                *(uint *)((long)&(((Timer *)(local_80._0_8_ + 8))->impl)._M_t.
                                 super___uniq_ptr_impl<Timer::impl_t,_std::default_delete<Timer::impl_t>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Timer::impl_t_*,_std::default_delete<Timer::impl_t>_>
                                 .super__Head_base<0UL,_Timer::impl_t_*,_false> + 4) =
                     this->player->id;
                local_40 = (pointer)Timer::GetTime();
                pWVar3 = this->world;
                local_70[0] = local_60;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_70,"ProtectDeathDrop","");
                pmVar6 = std::__detail::
                         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)&pWVar3->config,(key_type *)local_70);
                dVar10 = util::variant::GetFloat(pmVar6);
              }
              else {
                *(uint *)((long)&(((Timer *)(local_80._0_8_ + 8))->impl)._M_t.
                                 super___uniq_ptr_impl<Timer::impl_t,_std::default_delete<Timer::impl_t>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Timer::impl_t_*,_std::default_delete<Timer::impl_t>_>
                                 .super__Head_base<0UL,_Timer::impl_t_*,_false> + 4) =
                     local_38->player->id;
                local_40 = (pointer)Timer::GetTime();
                pWVar3 = this->world;
                local_70[0] = local_60;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_70,"ProtectPKDrop","");
                pmVar6 = std::__detail::
                         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)&pWVar3->config,(key_type *)local_70);
                dVar10 = util::variant::GetFloat(pmVar6);
              }
              *(double *)&(((Timer *)(local_80._0_8_ + 8))->timers)._M_t._M_impl =
                   (double)local_40 + dVar10;
              if (local_70[0] != local_60) {
                operator_delete(local_70[0],(ulong)((long)&local_60[0]->_M_next + 1));
              }
              num = 0;
              if (uVar8 < 5) {
                num = *(int *)(&DAT_001a407c + (ulong)uVar8 * 4);
              }
              bVar4 = Unequip(this->player->character,item,(uchar)num);
              if (bVar4) {
                PacketBuilder::PacketBuilder
                          ((PacketBuilder *)local_70,PACKET_PAPERDOLL,PACKET_REMOVE,0x2b);
                PacketBuilder::AddShort((PacketBuilder *)local_70,this->player->id);
                PacketBuilder::AddChar((PacketBuilder *)local_70,1);
                PacketBuilder::AddChar((PacketBuilder *)local_70,0);
                AddPaperdollData(this,(PacketBuilder *)local_70,"BAHWS");
                PacketBuilder::AddShort((PacketBuilder *)local_70,id);
                PacketBuilder::AddChar((PacketBuilder *)local_70,num);
                PacketBuilder::AddShort((PacketBuilder *)local_70,this->maxhp);
                PacketBuilder::AddShort((PacketBuilder *)local_70,this->maxtp);
                PacketBuilder::AddShort((PacketBuilder *)local_70,*this->display_str);
                PacketBuilder::AddShort((PacketBuilder *)local_70,*this->display_intl);
                PacketBuilder::AddShort((PacketBuilder *)local_70,*this->display_wis);
                PacketBuilder::AddShort((PacketBuilder *)local_70,*this->display_agi);
                PacketBuilder::AddShort((PacketBuilder *)local_70,*this->display_con);
                PacketBuilder::AddShort((PacketBuilder *)local_70,*this->display_cha);
                PacketBuilder::AddShort((PacketBuilder *)local_70,this->mindam);
                PacketBuilder::AddShort((PacketBuilder *)local_70,this->maxdam);
                PacketBuilder::AddShort((PacketBuilder *)local_70,this->accuracy);
                PacketBuilder::AddShort((PacketBuilder *)local_70,this->evade);
                PacketBuilder::AddShort((PacketBuilder *)local_70,this->armor);
                Player::Send(this->player,(PacketBuilder *)local_70);
                PacketBuilder::~PacketBuilder((PacketBuilder *)local_70);
              }
              DelItem(this->player->character,item,1);
              PacketBuilder::PacketBuilder((PacketBuilder *)local_70,PACKET_ITEM,PACKET_DROP,0xf);
              PacketBuilder::AddShort((PacketBuilder *)local_70,id);
              PacketBuilder::AddThree((PacketBuilder *)local_70,1);
              PacketBuilder::AddInt((PacketBuilder *)local_70,0);
              PacketBuilder::AddShort((PacketBuilder *)local_70,(int)(short)*(int *)local_80._0_8_);
              PacketBuilder::AddChar((PacketBuilder *)local_70,(uint)this->x);
              PacketBuilder::AddChar((PacketBuilder *)local_70,(uint)this->y);
              PacketBuilder::AddChar((PacketBuilder *)local_70,this->weight);
              PacketBuilder::AddChar((PacketBuilder *)local_70,this->maxweight);
              Player::Send(this->player,(PacketBuilder *)local_70);
              PacketBuilder::~PacketBuilder((PacketBuilder *)local_70);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
            }
          }
        }
      }
      lVar7 = lVar7 + 4;
      uVar8 = uVar8 + 1;
    } while (lVar7 != 0x324);
  }
  return;
}

Assistant:

void Character::DropAll(Character *killer)
{
	if (!CanInteractItems()) return;

	std::list<Character_Item>::iterator it = this->inventory.begin();

	while (it != this->inventory.end())
	{
		if (this->world->eif->Get(it->id).special == EIF::Lore)
		{
			++it;
			continue;
		}

		std::shared_ptr<Map_Item> map_item = this->player->character->map->AddItem(it->id, it->amount, this->x, this->y, 0);

		if (map_item)
		{
			if (killer)
			{
				map_item->owner = killer->PlayerID();
				map_item->unprotecttime = Timer::GetTime() + static_cast<double>(this->world->config["ProtectPKDrop"]);
			}
			else
			{
				map_item->owner = this->PlayerID();
				map_item->unprotecttime = Timer::GetTime() + static_cast<double>(this->world->config["ProtectDeathDrop"]);
			}

			PacketBuilder builder(PACKET_ITEM, PACKET_DROP, 15);
			builder.AddShort(it->id);
			builder.AddThree(it->amount);
			builder.AddInt(0);
			builder.AddShort(map_item->uid);
			builder.AddChar(this->x);
			builder.AddChar(this->y);
			builder.AddChar(this->weight);
			builder.AddChar(this->maxweight);
			this->Send(builder);
		}

		it = this->inventory.erase(it);
	}

	this->CalculateStats();

	int i = 0;
	UTIL_FOREACH(this->paperdoll, id)
	{
		if (id == 0 || this->world->eif->Get(id).special == EIF::Lore || this->world->eif->Get(id).special == EIF::Cursed)
		{
			++i;
			continue;
		}

		std::shared_ptr<Map_Item> map_item = this->player->character->map->AddItem(id, 1, this->x, this->y, 0);

		if (map_item)
		{
			if (killer)
			{
				map_item->owner = killer->PlayerID();
				map_item->unprotecttime = Timer::GetTime() + static_cast<double>(this->world->config["ProtectPKDrop"]);
			}
			else
			{
				map_item->owner = this->PlayerID();
				map_item->unprotecttime = Timer::GetTime() + static_cast<double>(this->world->config["ProtectDeathDrop"]);
			}

			int subloc = 0;

			if (i == Ring2 || i == Armlet2 || i == Bracer2)
			{
				subloc = 1;
			}

			if (this->player->character->Unequip(id, subloc))
			{
				PacketBuilder builder(PACKET_PAPERDOLL, PACKET_REMOVE, 43);
				builder.AddShort(this->PlayerID());
				builder.AddChar(SLOT_CLOTHES);
				builder.AddChar(0); // sound
				this->AddPaperdollData(builder, "BAHWS");
				builder.AddShort(id);
				builder.AddChar(subloc);
				builder.AddShort(this->maxhp);
				builder.AddShort(this->maxtp);
				builder.AddShort(this->display_str);
				builder.AddShort(this->display_intl);
				builder.AddShort(this->display_wis);
				builder.AddShort(this->display_agi);
				builder.AddShort(this->display_con);
				builder.AddShort(this->display_cha);
				builder.AddShort(this->mindam);
				builder.AddShort(this->maxdam);
				builder.AddShort(this->accuracy);
				builder.AddShort(this->evade);
				builder.AddShort(this->armor);
				this->Send(builder);
			}

			this->player->character->DelItem(id, 1);

			PacketBuilder builder(PACKET_ITEM, PACKET_DROP, 15);
			builder.AddShort(id);
			builder.AddThree(1);
			builder.AddInt(0);
			builder.AddShort(map_item->uid);
			builder.AddChar(this->x);
			builder.AddChar(this->y);
			builder.AddChar(this->weight);
			builder.AddChar(this->maxweight);
			this->Send(builder);
		}

		++i;
	}
}